

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O3

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<chaiscript::dispatch::Dynamic_Object>
          (Object_Data *this,Dynamic_Object *t,bool t_return_value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Dynamic_Object *__p;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar3;
  new_allocator<chaiscript::dispatch::Dynamic_Object> local_31;
  
  puVar1 = (undefined8 *)operator_new(0x68);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0030fe40;
  __p = (Dynamic_Object *)(puVar1 + 2);
  __gnu_cxx::new_allocator<chaiscript::dispatch::Dynamic_Object>::
  construct<chaiscript::dispatch::Dynamic_Object,chaiscript::dispatch::Dynamic_Object>
            (&local_31,__p,t);
  puVar2 = (undefined8 *)operator_new(0x20);
  puVar2[1] = &std::shared_ptr<chaiscript::dispatch::Dynamic_Object>::typeinfo;
  *puVar2 = &PTR__Data_Impl_0030fed0;
  puVar2[2] = __p;
  puVar2[3] = puVar1;
  *(undefined8 *)this = 0;
  puVar1 = (undefined8 *)operator_new(0x50);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0030d160;
  puVar1[2] = &chaiscript::dispatch::Dynamic_Object::typeinfo;
  puVar1[3] = &chaiscript::dispatch::Dynamic_Object::typeinfo;
  *(undefined4 *)(puVar1 + 4) = 0;
  puVar1[5] = puVar2;
  puVar1[6] = __p;
  puVar1[7] = __p;
  puVar1[8] = 0;
  *(undefined1 *)(puVar1 + 9) = 0;
  *(bool *)((long)puVar1 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar1;
  *(undefined8 **)this = puVar1 + 2;
  sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          &chaiscript::dispatch::Dynamic_Object::typeinfo;
  sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(T t, bool t_return_value)
          {
            auto p = std::make_shared<T>(std::move(t));
            auto ptr = p.get();
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(std::move(p)),
                  false,
                  ptr,
                  t_return_value
                );
          }